

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O0

_Bool borg_happy_grid_bold(wchar_t y,wchar_t x)

{
  _Bool _Var1;
  borg_grid *pbVar2;
  borg_grid *ag;
  wchar_t i;
  wchar_t x_local;
  wchar_t y_local;
  
  pbVar2 = borg_grids[y] + x;
  if ((((y < L'@') && (L'\x02' < y)) && (x < L'Ä')) && (L'\x02' < x)) {
    if (pbVar2->feat == '\x05') {
      x_local._3_1_ = true;
    }
    else if (pbVar2->feat == '\x06') {
      x_local._3_1_ = true;
    }
    else if ((pbVar2->glyph & 1U) == 0) {
      if ((pbVar2->feat == '\x17') && (borg.trait[0x40] == 0)) {
        x_local._3_1_ = false;
      }
      else if ((borg.trait[0x6c] == 0) && (borg.trait[0x1a] != 0)) {
        if (borg_t - borg_began < 2000) {
          _Var1 = borg_cave_floor_bold(y + L'\xffffffff',x);
          if (((!_Var1) || (_Var1 = borg_cave_floor_bold(y + L'\x01',x), !_Var1)) ||
             ((_Var1 = borg_cave_floor_bold(y,x + L'\xffffffff'), _Var1 ||
              ((((_Var1 = borg_cave_floor_bold(y,x + L'\x01'), _Var1 ||
                 (_Var1 = borg_cave_floor_bold(y + L'\x01',x + L'\xffffffff'), _Var1)) ||
                (_Var1 = borg_cave_floor_bold(y + L'\x01',x + L'\x01'), _Var1)) ||
               ((_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x + L'\xffffffff'), _Var1 ||
                (_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x + L'\x01'), _Var1)))))))) {
            _Var1 = borg_cave_floor_bold(y,x + L'\xffffffff');
            if (((!_Var1) ||
                ((_Var1 = borg_cave_floor_bold(y,x + L'\x01'), !_Var1 ||
                 (_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x), _Var1)))) ||
               (((_Var1 = borg_cave_floor_bold(y + L'\x01',x), _Var1 ||
                 (((_Var1 = borg_cave_floor_bold(y + L'\x01',x + L'\xffffffff'), _Var1 ||
                   (_Var1 = borg_cave_floor_bold(y + L'\x01',x + L'\x01'), _Var1)) ||
                  (_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x + L'\xffffffff'), _Var1)))) ||
                (_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x + L'\x01'), _Var1)))) {
              _Var1 = borg_cave_floor_bold(y + L'\xffffffff',x);
              if (((!_Var1) || (_Var1 = borg_cave_floor_bold(y + L'\x01',x), !_Var1)) ||
                 ((_Var1 = borg_cave_floor_bold(y,x + L'\xffffffff'), _Var1 ||
                  (_Var1 = borg_cave_floor_bold(y,x + L'\x01'), _Var1)))) {
                _Var1 = borg_cave_floor_bold(y,x + L'\xffffffff');
                if ((((!_Var1) || (_Var1 = borg_cave_floor_bold(y,x + L'\x01'), !_Var1)) ||
                    (_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x), _Var1)) ||
                   (_Var1 = borg_cave_floor_bold(y + L'\x01',x), _Var1)) {
                  _Var1 = borg_cave_floor_bold(y + L'\xffffffff',x);
                  if ((((_Var1) ||
                       (_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x + L'\xffffffff'), !_Var1))
                      || (_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x + L'\x01'), !_Var1)) ||
                     (_Var1 = borg_cave_floor_bold(y + L'\xfffffffe',x), !_Var1)) {
                    _Var1 = borg_cave_floor_bold(y + L'\x01',x);
                    if (((_Var1) ||
                        (_Var1 = borg_cave_floor_bold(y + L'\x01',x + L'\xffffffff'), !_Var1)) ||
                       ((_Var1 = borg_cave_floor_bold(y + L'\x01',x + L'\x01'), !_Var1 ||
                        (_Var1 = borg_cave_floor_bold(y + L'\x02',x), !_Var1)))) {
                      _Var1 = borg_cave_floor_bold(y,x + L'\x01');
                      if (((_Var1) ||
                          (_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x + L'\x01'), !_Var1)) ||
                         ((_Var1 = borg_cave_floor_bold(y + L'\x01',x + L'\x01'), !_Var1 ||
                          (_Var1 = borg_cave_floor_bold(y,x + L'\x02'), !_Var1)))) {
                        _Var1 = borg_cave_floor_bold(y,x + L'\xffffffff');
                        if ((((_Var1) ||
                             (_Var1 = borg_cave_floor_bold(y + L'\xffffffff',x + L'\xffffffff'),
                             !_Var1)) ||
                            (_Var1 = borg_cave_floor_bold(y + L'\x01',x + L'\xffffffff'), !_Var1))
                           || (_Var1 = borg_cave_floor_bold(y,x + L'\xfffffffe'), !_Var1)) {
                          for (ag._0_4_ = 0; (int)ag < track_step.num; ag._0_4_ = (int)ag + 1) {
                            if (((track_step.y[(int)ag] == y) && (track_step.x[(int)ag] == x)) &&
                               ((int)ag < 0x19)) {
                              return true;
                            }
                          }
                          x_local._3_1_ = false;
                        }
                        else {
                          x_local._3_1_ = true;
                        }
                      }
                      else {
                        x_local._3_1_ = true;
                      }
                    }
                    else {
                      x_local._3_1_ = true;
                    }
                  }
                  else {
                    x_local._3_1_ = true;
                  }
                }
                else {
                  x_local._3_1_ = true;
                }
              }
              else {
                x_local._3_1_ = true;
              }
            }
            else {
              x_local._3_1_ = true;
            }
          }
          else {
            x_local._3_1_ = true;
          }
        }
        else {
          x_local._3_1_ = false;
        }
      }
      else {
        x_local._3_1_ = false;
      }
    }
    else {
      x_local._3_1_ = true;
    }
  }
  else {
    x_local._3_1_ = false;
  }
  return x_local._3_1_;
}

Assistant:

bool borg_happy_grid_bold(int y, int x)
{
    int i;

    borg_grid *ag = &borg_grids[y][x];

    /* Bounds Check */
    if (y >= DUNGEON_HGT - 2 || y <= 2 || x >= DUNGEON_WID - 2 || x <= 2)
        return false;

    /* Accept stairs */
    if (ag->feat == FEAT_LESS)
        return true;
    if (ag->feat == FEAT_MORE)
        return true;
    if (ag->glyph)
        return true;
    if (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
        return false;

    /* Hack -- weak/dark is very unhappy */
    if (borg.trait[BI_ISWEAK] || borg.trait[BI_LIGHT] == 0)
        return false;

    /* Apply a control effect so that he does not get stuck in a loop */
    if ((borg_t - borg_began) >= 2000)
        return false;

    /* Case 1a: north-south corridor */
    if (borg_cave_floor_bold(y - 1, x) && borg_cave_floor_bold(y + 1, x)
        && !borg_cave_floor_bold(y, x - 1) && !borg_cave_floor_bold(y, x + 1)
        && !borg_cave_floor_bold(y + 1, x - 1)
        && !borg_cave_floor_bold(y + 1, x + 1)
        && !borg_cave_floor_bold(y - 1, x - 1)
        && !borg_cave_floor_bold(y - 1, x + 1)) {
        /* Happy */
        return true;
    }

    /* Case 1b: east-west corridor */
    if (borg_cave_floor_bold(y, x - 1) && borg_cave_floor_bold(y, x + 1)
        && !borg_cave_floor_bold(y - 1, x) && !borg_cave_floor_bold(y + 1, x)
        && !borg_cave_floor_bold(y + 1, x - 1)
        && !borg_cave_floor_bold(y + 1, x + 1)
        && !borg_cave_floor_bold(y - 1, x - 1)
        && !borg_cave_floor_bold(y - 1, x + 1)) {
        /* Happy */
        return true;
    }

    /* Case 1aa: north-south doorway */
    if (borg_cave_floor_bold(y - 1, x) && borg_cave_floor_bold(y + 1, x)
        && !borg_cave_floor_bold(y, x - 1) && !borg_cave_floor_bold(y, x + 1)) {
        /* Happy */
        return true;
    }

    /* Case 1ba: east-west doorway */
    if (borg_cave_floor_bold(y, x - 1) && borg_cave_floor_bold(y, x + 1)
        && !borg_cave_floor_bold(y - 1, x) && !borg_cave_floor_bold(y + 1, x)) {
        /* Happy */
        return true;
    }

    /* Case 2a: north pillar */
    if (!borg_cave_floor_bold(y - 1, x) && borg_cave_floor_bold(y - 1, x - 1)
        && borg_cave_floor_bold(y - 1, x + 1)
        && borg_cave_floor_bold(y - 2, x)) {
        /* Happy */
        return true;
    }

    /* Case 2b: south pillar */
    if (!borg_cave_floor_bold(y + 1, x) && borg_cave_floor_bold(y + 1, x - 1)
        && borg_cave_floor_bold(y + 1, x + 1)
        && borg_cave_floor_bold(y + 2, x)) {
        /* Happy */
        return true;
    }

    /* Case 2c: east pillar */
    if (!borg_cave_floor_bold(y, x + 1) && borg_cave_floor_bold(y - 1, x + 1)
        && borg_cave_floor_bold(y + 1, x + 1)
        && borg_cave_floor_bold(y, x + 2)) {
        /* Happy */
        return true;
    }

    /* Case 2d: west pillar */
    if (!borg_cave_floor_bold(y, x - 1) && borg_cave_floor_bold(y - 1, x - 1)
        && borg_cave_floor_bold(y + 1, x - 1)
        && borg_cave_floor_bold(y, x - 2)) {
        /* Happy */
        return true;
    }

    /* check for grids that have been stepped on before */
    for (i = 0; i < track_step.num; i++) {
        /* Enqueue the grid */
        if ((track_step.y[i] == y) && (track_step.x[i] == x)) {
            /* Recent step is good */
            if (i < 25) {
                return true;
            }
        }
    }

    /* Not happy */
    return false;
}